

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O0

void draw_arrow(Fl_Color col)

{
  Fl_Color col_local;
  
  fl_color(col);
  fl_begin_polygon();
  fl_vertex(0.65,0.1);
  fl_vertex(1.0,0.0);
  fl_vertex(0.65,-0.1);
  fl_end_polygon();
  fl_begin_line();
  fl_vertex(-1.0,0.0);
  fl_vertex(0.65,0.0);
  fl_end_line();
  set_outline_color(col);
  fl_begin_line();
  fl_vertex(-1.0,0.0);
  fl_vertex(0.65,0.0);
  fl_end_line();
  fl_begin_loop();
  fl_vertex(0.65,0.1);
  fl_vertex(1.0,0.0);
  fl_vertex(0.65,-0.1);
  fl_end_loop();
  return;
}

Assistant:

static void draw_arrow(Fl_Color col)
{
  fl_color(col);
  BP; vv(0.65,0.1); vv(1.0,0.0); vv(0.65,-0.1); EP;
  BL; vv(-1.0,0.0); vv(0.65,0.0); EL;
  set_outline_color(col);
  BL; vv(-1.0,0.0); vv(0.65,0.0); EL;
  BC; vv(0.65,0.1); vv(1.0,0.0); vv(0.65,-0.1); EC;
}